

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::ParsedIR::get_decoration(ParsedIR *this,ID id,Decoration decoration)

{
  bool bVar1;
  Meta *pMVar2;
  Decoration *dec;
  Meta *m;
  Decoration decoration_local;
  ParsedIR *this_local;
  ID id_local;
  
  pMVar2 = find_meta(this,id);
  if (pMVar2 == (Meta *)0x0) {
    this_local._4_4_ = FPRoundingModeRTE;
  }
  else {
    bVar1 = Bitset::get(&(pMVar2->decoration).decoration_flags,decoration);
    if (bVar1) {
      switch(decoration) {
      case DecorationSpecId:
        this_local._4_4_ = (pMVar2->decoration).spec_id;
        break;
      default:
        this_local._4_4_ = FPRoundingModeRTZ;
        break;
      case ArrayStride:
        this_local._4_4_ = (pMVar2->decoration).array_stride;
        break;
      case DecorationMatrixStride:
        this_local._4_4_ = (pMVar2->decoration).matrix_stride;
        break;
      case BuiltIn:
        this_local._4_4_ = (pMVar2->decoration).builtin_type;
        break;
      case DecorationStream:
        this_local._4_4_ = (pMVar2->decoration).stream;
        break;
      case DecorationLocation:
        this_local._4_4_ = (pMVar2->decoration).location;
        break;
      case Component:
        this_local._4_4_ = (pMVar2->decoration).component;
        break;
      case DecorationIndex:
        this_local._4_4_ = (pMVar2->decoration).index;
        break;
      case Binding:
        this_local._4_4_ = (pMVar2->decoration).binding;
        break;
      case DecorationDescriptorSet:
        this_local._4_4_ = (pMVar2->decoration).set;
        break;
      case DecorationOffset:
        this_local._4_4_ = (pMVar2->decoration).offset;
        break;
      case DecorationXfbBuffer:
        this_local._4_4_ = (pMVar2->decoration).xfb_buffer;
        break;
      case DecorationXfbStride:
        this_local._4_4_ = (pMVar2->decoration).xfb_stride;
        break;
      case DecorationFPRoundingMode:
        this_local._4_4_ = (pMVar2->decoration).fp_rounding_mode;
        break;
      case DecorationInputAttachmentIndex:
        this_local._4_4_ = (pMVar2->decoration).input_attachment;
      }
    }
    else {
      this_local._4_4_ = FPRoundingModeRTE;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ParsedIR::get_decoration(ID id, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationBinding:
		return dec.binding;
	case DecorationDescriptorSet:
		return dec.set;
	case DecorationInputAttachmentIndex:
		return dec.input_attachment;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationArrayStride:
		return dec.array_stride;
	case DecorationMatrixStride:
		return dec.matrix_stride;
	case DecorationIndex:
		return dec.index;
	case DecorationFPRoundingMode:
		return dec.fp_rounding_mode;
	default:
		return 1;
	}
}